

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int arkStep_AttachMasssol
              (ARKodeMem ark_mem,ARKMassInitFn minit,ARKMassSetupFn msetup,ARKMassMultFn mmult,
              ARKMassSolveFn msolve,ARKMassFreeFn mfree,int time_dep,
              SUNLinearSolver_Type msolve_type,void *mass_mem)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  
  iVar1 = arkStep_AccessStepMem(ark_mem,"arkStep_AttachMasssol",&step_mem);
  if (iVar1 == 0) {
    if (step_mem->mfree != (ARKMassFreeFn)0x0) {
      (*step_mem->mfree)(ark_mem);
    }
    step_mem->minit = minit;
    step_mem->msetup = msetup;
    step_mem->mmult = mmult;
    step_mem->msolve = msolve;
    step_mem->mfree = mfree;
    step_mem->mass_mem = mass_mem;
    step_mem->mass_type = 2 - (uint)(time_dep == 0);
    step_mem->msolve_type = msolve_type;
    ark_mem->step_mmult = mmult;
  }
  return iVar1;
}

Assistant:

int arkStep_AttachMasssol(ARKodeMem ark_mem, ARKMassInitFn minit,
                          ARKMassSetupFn msetup, ARKMassMultFn mmult,
                          ARKMassSolveFn msolve, ARKMassFreeFn mfree,
                          sunbooleantype time_dep,
                          SUNLinearSolver_Type msolve_type, void* mass_mem)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* free any existing mass matrix solver */
  if (step_mem->mfree != NULL) { step_mem->mfree(ark_mem); }

  /* Attach the provided routines, data structure and solve type */
  step_mem->minit       = minit;
  step_mem->msetup      = msetup;
  step_mem->mmult       = mmult;
  step_mem->msolve      = msolve;
  step_mem->mfree       = mfree;
  step_mem->mass_mem    = mass_mem;
  step_mem->mass_type   = (time_dep) ? MASS_TIMEDEP : MASS_FIXED;
  step_mem->msolve_type = msolve_type;

  /* Attach mmult function pointer to ark_mem as well */
  ark_mem->step_mmult = mmult;

  return (ARK_SUCCESS);
}